

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O0

int para_compute(int ele1,int ele2)

{
  int ele2_local;
  int ele1_local;
  
  switch(ele1) {
  case 0:
    switch(ele2) {
    case 2:
      return 6;
    case 3:
      return 7;
    case 4:
      return 9;
    case 5:
      return 8;
    }
    break;
  case 1:
    switch(ele2) {
    case 2:
      return 10;
    case 3:
      return 0xb;
    case 4:
      return 0xd;
    case 5:
      return 0xc;
    }
    break;
  case 2:
    switch(ele2) {
    case 0:
      return 6;
    case 1:
      return 10;
    default:
      break;
    case 4:
      return 0xf;
    case 5:
      return 0xe;
    }
    break;
  case 3:
    switch(ele2) {
    case 0:
      return 7;
    case 1:
      return 0xb;
    default:
      break;
    case 4:
      return 0x11;
    case 5:
      return 0x10;
    }
    break;
  case 4:
    switch(ele2) {
    case 0:
      return 9;
    case 1:
      return 0xd;
    case 2:
      return 0xf;
    case 3:
      return 0x11;
    }
    break;
  case 5:
    switch(ele2) {
    case 0:
      return 8;
    case 1:
      return 0xc;
    case 2:
      return 0xe;
    case 3:
      return 0x10;
    }
  }
  return -1;
}

Assistant:

int para_compute(int ele1, int ele2)
{
	switch (ele1)
	{
		case ELE_HEAT:
			switch (ele2)
			{
				case ELE_AIR:			return ELE_SMOKE;
				case ELE_EARTH:			return ELE_MAGMA;
				case ELE_WATER:			return ELE_ACID;
				case ELE_ELECTRICITY:	return ELE_PLASMA;
				default:				break;
			}

			break;
		case ELE_COLD:
			switch (ele2)
			{
				case ELE_AIR:			return ELE_BLIZZARD;
				case ELE_EARTH:			return ELE_FROST;
				case ELE_WATER:			return ELE_ICE;
				case ELE_ELECTRICITY:	return ELE_CRYSTAL;
				default:				break;
			}

			break;
		case ELE_AIR:
			switch (ele2)
			{	
				case ELE_HEAT:			return ELE_SMOKE;
				case ELE_COLD:			return ELE_BLIZZARD;
				case ELE_WATER:			return ELE_MIST;
				case ELE_ELECTRICITY:	return ELE_LIGHTNING;
				default:				break;
			}

			break;
		case ELE_EARTH:
			switch (ele2)
			{	
				case ELE_HEAT:			return ELE_MAGMA;
				case ELE_COLD:			return ELE_FROST;
				case ELE_WATER:			return ELE_OOZE;
				case ELE_ELECTRICITY:	return ELE_METAL;
				default:				break;
			}

			break;
		case ELE_WATER:
			switch (ele2)
			{
				case ELE_HEAT:			return ELE_ACID;
				case ELE_COLD:			return ELE_ICE;
				case ELE_AIR:			return ELE_MIST;
				case ELE_EARTH:			return ELE_OOZE;
				default:				break;
			}

			break;
		case ELE_ELECTRICITY:
			switch (ele2)
			{
				case ELE_HEAT:			return ELE_PLASMA;
				case ELE_COLD:			return ELE_CRYSTAL;
				case ELE_AIR:			return ELE_LIGHTNING;
				case ELE_EARTH:			return ELE_METAL;
				default:				break;
			}

			break;
		default:
			break;
	}

	return -1;
}